

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_ptr_tests.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_71cb::StatePointer_SetState_Test::TestBody(StatePointer_SetState_Test *this)

{
  bool bVar1;
  char *pcVar2;
  Foo **in_RCX;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *rhs;
  Foo foo;
  state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL> p;
  AssertionResult gtest_ar;
  AssertHelper local_20;
  
  putl::state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL>::state_ptr
            ((state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL> *)&stack0xffffffffffffffc0,
             (pointer_type)&stack0xffffffffffffffbc,1);
  gtest_ar.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       putl::state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL>::get_ptr
                 ((state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL> *)
                  &stack0xffffffffffffffc0);
  local_20.data_ = (AssertHelperData *)&stack0xffffffffffffffbc;
  testing::internal::EqHelper<false>::
  Compare<(anonymous_namespace)::Foo*,(anonymous_namespace)::Foo*>
            ((char *)&p,(char *)&gtest_ar.message_,(Foo **)&local_20,in_RCX);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)&p);
  if (bVar1) {
    testing::AssertionResult::~AssertionResult((AssertionResult *)&p);
  }
  else {
    testing::Message::Message((Message *)&gtest_ar.message_);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)&p);
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Robbepop[P]state_ptr/testsrc/state_ptr_tests.cpp"
               ,0x26,pcVar2);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&gtest_ar.message_);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    testing::Message::~Message((Message *)&gtest_ar.message_);
    testing::AssertionResult::~AssertionResult((AssertionResult *)&p);
    if (!bVar1) {
      return;
    }
  }
  gtest_ar.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       putl::state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL>::get_state
                 ((state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL> *)
                  &stack0xffffffffffffffc0);
  rhs = &gtest_ar.message_;
  local_20.data_ = (AssertHelperData *)0x1;
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)&p,"p.get_state()","1ul",(unsigned_long *)rhs,
             (unsigned_long *)&local_20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)&p);
  if (bVar1) {
    testing::AssertionResult::~AssertionResult((AssertionResult *)&p);
  }
  else {
    testing::Message::Message((Message *)&gtest_ar.message_);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)&p);
    rhs = (scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)0x27;
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Robbepop[P]state_ptr/testsrc/state_ptr_tests.cpp"
               ,0x27,pcVar2);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&gtest_ar.message_);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    testing::Message::~Message((Message *)&gtest_ar.message_);
    testing::AssertionResult::~AssertionResult((AssertionResult *)&p);
    if (!bVar1) {
      return;
    }
  }
  putl::state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL>::set_state
            ((state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL> *)&stack0xffffffffffffffc0,2
            );
  gtest_ar.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       putl::state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL>::get_ptr
                 ((state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL> *)
                  &stack0xffffffffffffffc0);
  local_20.data_ = (AssertHelperData *)&stack0xffffffffffffffbc;
  testing::internal::EqHelper<false>::
  Compare<(anonymous_namespace)::Foo*,(anonymous_namespace)::Foo*>
            ((char *)&p,(char *)&gtest_ar.message_,(Foo **)&local_20,(Foo **)rhs);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)&p);
  if (bVar1) {
    testing::AssertionResult::~AssertionResult((AssertionResult *)&p);
  }
  else {
    testing::Message::Message((Message *)&gtest_ar.message_);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)&p);
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Robbepop[P]state_ptr/testsrc/state_ptr_tests.cpp"
               ,0x29,pcVar2);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&gtest_ar.message_);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    testing::Message::~Message((Message *)&gtest_ar.message_);
    testing::AssertionResult::~AssertionResult((AssertionResult *)&p);
    if (!bVar1) {
      return;
    }
  }
  gtest_ar.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       putl::state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL>::get_state
                 ((state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL> *)
                  &stack0xffffffffffffffc0);
  local_20.data_ = (AssertHelperData *)&DAT_00000002;
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)&p,"p.get_state()","2ul",(unsigned_long *)&gtest_ar.message_,
             (unsigned_long *)&local_20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)&p);
  if (!bVar1) {
    testing::Message::Message((Message *)&gtest_ar.message_);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)&p);
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Robbepop[P]state_ptr/testsrc/state_ptr_tests.cpp"
               ,0x2a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&gtest_ar.message_);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    testing::Message::~Message((Message *)&gtest_ar.message_);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)&p);
  return;
}

Assistant:

TEST(StatePointer, SetState) {
	Foo foo;
	state_ptr<Foo> p{&foo, 1};
	ASSERT_EQ(p.get_ptr(), &foo);
	ASSERT_EQ(p.get_state(), 1ul);
	p.set_state(2);
	ASSERT_EQ(p.get_ptr(), &foo);
	ASSERT_EQ(p.get_state(), 2ul);
}